

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_ssm_conv(ggml_compute_params *params,ggml_tensor *dst)

{
  long in_RSI;
  ggml_tensor *in_stack_00000058;
  ggml_compute_params *in_stack_00000060;
  
  if (**(int **)(in_RSI + 0x98) == 0) {
    ggml_compute_forward_ssm_conv_f32(in_stack_00000060,in_stack_00000058);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ops.cpp"
             ,0x1d4b,"fatal error");
}

Assistant:

void ggml_compute_forward_ssm_conv(
        const ggml_compute_params * params,
        ggml_tensor * dst) {
    switch (dst->src[0]->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_ssm_conv_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}